

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEAngle.cpp
# Opt level: O2

bool __thiscall test_CEAngle::test_retrieve(test_CEAngle *this)

{
  undefined1 uVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<double> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  initializer_list<double> __l_08;
  allocator local_fe;
  allocator local_fd;
  CEAngleType local_fc;
  vector<double,_std::allocator<double>_> local_f8;
  undefined8 uStack_e0;
  vector<double,_std::allocator<double>_> local_d8;
  CEAngle test_ang3;
  CEAngle test_ang2;
  string dms_str;
  string hms_str;
  double angle;
  double test_deg;
  CEAngle test_ang;
  
  angle = 3.141592653589793;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x4066800000000000;
  CEAngle::Deg((CEAngle *)&dms_str,(double *)&local_d8);
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CEAngle::operator_cast_to_double((CEAngle *)&dms_str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&hms_str,"test_retrieve",(allocator *)&test_ang3);
  test_ang2._vptr_CEAngle = (_func_int **)CONCAT44(test_ang2._vptr_CEAngle._4_4_,0xb0);
  (**(code **)(*(long *)this + 0x58))(this,&local_f8,&angle,&hms_str);
  std::__cxx11::string::~string((string *)&hms_str);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test_ang3);
  CEAngle::~CEAngle((CEAngle *)&dms_str);
  CEAngle::Rad((CEAngle *)&dms_str,&angle);
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CEAngle::operator_cast_to_double((CEAngle *)&dms_str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&hms_str,"test_retrieve",(allocator *)&test_ang2);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0xb2;
  (**(code **)(*(long *)this + 0x58))(this,&local_f8,&angle,&hms_str);
  std::__cxx11::string::~string((string *)&hms_str);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test_ang2);
  CEAngle::~CEAngle((CEAngle *)&dms_str);
  test_ang2._vptr_CEAngle = (_func_int **)((ulong)test_ang2._vptr_CEAngle & 0xffffffffffffff00);
  CEAngle::Hms((CEAngle *)&dms_str,"12:00:00",(char *)&test_ang2);
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CEAngle::operator_cast_to_double((CEAngle *)&dms_str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&hms_str,"test_retrieve",(allocator *)&test_ang3);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0xb4;
  (**(code **)(*(long *)this + 0x58))(this,&local_f8,&angle,&hms_str);
  std::__cxx11::string::~string((string *)&hms_str);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test_ang3);
  CEAngle::~CEAngle((CEAngle *)&dms_str);
  test_ang2._vptr_CEAngle = (_func_int **)((ulong)test_ang2._vptr_CEAngle & 0xffffffffffffff00);
  CEAngle::Hms((CEAngle *)&dms_str,"12 00 00",(char *)&test_ang2);
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CEAngle::operator_cast_to_double((CEAngle *)&dms_str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&hms_str,"test_retrieve",(allocator *)&test_ang3);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0xb5;
  (**(code **)(*(long *)this + 0x58))(this,&local_f8,&angle,&hms_str);
  std::__cxx11::string::~string((string *)&hms_str);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test_ang3);
  CEAngle::~CEAngle((CEAngle *)&dms_str);
  test_ang2._vptr_CEAngle = (_func_int **)CONCAT71(test_ang2._vptr_CEAngle._1_7_,0x2e);
  CEAngle::Hms((CEAngle *)&dms_str,"12.00.00",(char *)&test_ang2);
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CEAngle::operator_cast_to_double((CEAngle *)&dms_str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&hms_str,"test_retrieve",(allocator *)&test_ang3);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0xb6;
  (**(code **)(*(long *)this + 0x58))(this,&local_f8,&angle,&hms_str);
  std::__cxx11::string::~string((string *)&hms_str);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test_ang3);
  CEAngle::~CEAngle((CEAngle *)&dms_str);
  hms_str.field_2._M_allocated_capacity = 0;
  hms_str.field_2._8_8_ = 0;
  hms_str._M_dataplus._M_p = (pointer)0x4028000000000000;
  hms_str._M_string_length = 0;
  std::allocator<double>::allocator((allocator<double> *)&test_ang);
  __l._M_len = 4;
  __l._M_array = (iterator)&hms_str;
  std::vector<double,_std::allocator<double>_>::vector(&local_f8,__l,(allocator_type *)&test_ang);
  CEAngle::Hms((CEAngle *)&local_d8,&local_f8);
  test_ang2._vptr_CEAngle = (_func_int **)CEAngle::operator_cast_to_double((CEAngle *)&local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&dms_str,"test_retrieve",(allocator *)&test_deg);
  test_ang3._vptr_CEAngle = (_func_int **)CONCAT44(test_ang3._vptr_CEAngle._4_4_,0xb8);
  (**(code **)(*(long *)this + 0x58))(this,&test_ang2,&angle,&dms_str);
  std::__cxx11::string::~string((string *)&dms_str);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test_deg);
  CEAngle::~CEAngle((CEAngle *)&local_d8);
  std::vector<double,_std::allocator<double>_>::~vector(&local_f8);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&test_ang);
  test_ang2._vptr_CEAngle = (_func_int **)((ulong)test_ang2._vptr_CEAngle & 0xffffffffffffff00);
  CEAngle::Dms((CEAngle *)&dms_str,"180:00:00",(char *)&test_ang2);
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CEAngle::operator_cast_to_double((CEAngle *)&dms_str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&hms_str,"test_retrieve",(allocator *)&test_ang3);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0xba;
  (**(code **)(*(long *)this + 0x58))(this,&local_f8,&angle,&hms_str);
  std::__cxx11::string::~string((string *)&hms_str);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test_ang3);
  CEAngle::~CEAngle((CEAngle *)&dms_str);
  test_ang2._vptr_CEAngle = (_func_int **)((ulong)test_ang2._vptr_CEAngle & 0xffffffffffffff00);
  CEAngle::Dms((CEAngle *)&dms_str,"180 00 00",(char *)&test_ang2);
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CEAngle::operator_cast_to_double((CEAngle *)&dms_str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&hms_str,"test_retrieve",(allocator *)&test_ang3);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0xbb;
  (**(code **)(*(long *)this + 0x58))(this,&local_f8,&angle,&hms_str);
  std::__cxx11::string::~string((string *)&hms_str);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test_ang3);
  CEAngle::~CEAngle((CEAngle *)&dms_str);
  test_ang2._vptr_CEAngle = (_func_int **)CONCAT71(test_ang2._vptr_CEAngle._1_7_,0x27);
  CEAngle::Dms((CEAngle *)&dms_str,"180\'00\'00",(char *)&test_ang2);
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CEAngle::operator_cast_to_double((CEAngle *)&dms_str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&hms_str,"test_retrieve",(allocator *)&test_ang3);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0xbc;
  (**(code **)(*(long *)this + 0x58))(this,&local_f8,&angle,&hms_str);
  std::__cxx11::string::~string((string *)&hms_str);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test_ang3);
  CEAngle::~CEAngle((CEAngle *)&dms_str);
  hms_str.field_2._M_allocated_capacity = 0;
  hms_str.field_2._8_8_ = 0;
  hms_str._M_dataplus._M_p = (pointer)0x4066800000000000;
  hms_str._M_string_length = 0;
  std::allocator<double>::allocator((allocator<double> *)&test_ang);
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&hms_str;
  std::vector<double,_std::allocator<double>_>::vector(&local_f8,__l_00,(allocator_type *)&test_ang)
  ;
  CEAngle::Dms((CEAngle *)&local_d8,&local_f8);
  test_ang2._vptr_CEAngle = (_func_int **)CEAngle::operator_cast_to_double((CEAngle *)&local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&dms_str,"test_retrieve",(allocator *)&test_deg);
  test_ang3._vptr_CEAngle = (_func_int **)CONCAT44(test_ang3._vptr_CEAngle._4_4_,0xbe);
  (**(code **)(*(long *)this + 0x58))(this,&test_ang2,&angle,&dms_str);
  std::__cxx11::string::~string((string *)&dms_str);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test_deg);
  CEAngle::~CEAngle((CEAngle *)&local_d8);
  std::vector<double,_std::allocator<double>_>::~vector(&local_f8);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&test_ang);
  test_deg = 315.25;
  hms_str._M_dataplus._M_p = (pointer)0x40160233bb643c1c;
  CEAngle::CEAngle(&test_ang,(double *)&hms_str);
  dms_str._M_dataplus._M_p = (pointer)CEAngle::Deg(&test_ang);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&hms_str,"test_retrieve",(allocator *)&local_d8);
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,0xc6);
  (**(code **)(*(long *)this + 0x58))(this,&dms_str,&test_deg,&hms_str);
  std::__cxx11::string::~string((string *)&hms_str);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_d8);
  dms_str._M_dataplus._M_p = (pointer)CEAngle::Rad(&test_ang);
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(test_deg * 0.017453292519943295);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&hms_str,"test_retrieve",(allocator *)&test_ang2);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0xc9;
  (**(code **)(*(long *)this + 0x58))(this,&dms_str,&local_f8,&hms_str);
  std::__cxx11::string::~string((string *)&hms_str);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test_ang2);
  dms_str._M_dataplus._M_p._0_1_ = 0x27;
  CEAngle::HmsStr_abi_cxx11_(&hms_str,&test_ang,(char *)&dms_str);
  _Var2._M_current = (char *)std::__cxx11::string::begin();
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)std::__cxx11::string::begin();
  _Var3 = __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_f8,0xb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((string *)&dms_str,_Var2,_Var3,(allocator<char> *)&local_d8);
  std::__cxx11::string::operator=((string *)&hms_str,(string *)&dms_str);
  std::__cxx11::string::~string((string *)&dms_str);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&dms_str,"21\'01\'00.00",(allocator *)&test_ang2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"test_retrieve",(allocator *)&test_ang3);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,0xce);
  (**(code **)(*(long *)this + 0x70))(this,&hms_str,&dms_str,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test_ang3);
  std::__cxx11::string::~string((string *)&dms_str);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test_ang2);
  CEAngle::HmsVect(&local_d8,&test_ang);
  dms_str.field_2._M_allocated_capacity = 0;
  dms_str.field_2._8_8_ = 0;
  dms_str._M_dataplus._M_p = (pointer)0x4035000000000000;
  dms_str._M_string_length = 0x3ff0000000000000;
  std::allocator<double>::allocator((allocator<double> *)&local_fc);
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&dms_str;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&test_ang2,__l_01,
             (allocator<double> *)&local_fc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"test_retrieve",&local_fe);
  test_ang3._vptr_CEAngle = (_func_int **)CONCAT44(test_ang3._vptr_CEAngle._4_4_,0xd1);
  CETestSuite::test_vect((vector *)this,(vector *)&local_d8,(string *)&test_ang2,(int *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_fe);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&test_ang2);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_fc);
  std::vector<double,_std::allocator<double>_>::~vector(&local_d8);
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start._1_7_,0x22);
  CEAngle::DmsStr_abi_cxx11_(&dms_str,&test_ang,(char *)&local_f8);
  _Var2._M_current = (char *)std::__cxx11::string::begin();
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)std::__cxx11::string::begin();
  _Var3 = __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_d8,0xc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((string *)&local_f8,_Var2,_Var3,(allocator<char> *)&test_ang2);
  std::__cxx11::string::operator=((string *)&dms_str,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test_ang2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"315\"15\"00.00",(allocator *)&test_ang3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"test_retrieve",(allocator *)&local_fc);
  test_ang2._vptr_CEAngle = (_func_int **)CONCAT44(test_ang2._vptr_CEAngle._4_4_,0xd6);
  (**(code **)(*(long *)this + 0x70))(this,&dms_str,&local_f8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_fc);
  std::__cxx11::string::~string((string *)&local_f8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test_ang3);
  CEAngle::DmsVect((vector<double,_std::allocator<double>_> *)&test_ang2,&test_ang);
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uStack_e0 = 0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x4073b00000000000;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x402e000000000000;
  std::allocator<double>::allocator((allocator<double> *)&local_fe);
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_f8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&test_ang3,__l_02,
             (allocator<double> *)&local_fe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"test_retrieve",&local_fd);
  local_fc = 0xd9;
  CETestSuite::test_vect((vector *)this,(vector *)&test_ang2,(string *)&test_ang3,(int *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_fd);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&test_ang3);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_fe);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&test_ang2);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CEAngle::operator_cast_to_double(&test_ang);
  test_ang2._vptr_CEAngle = (_func_int **)(test_deg * 0.017453292519943295);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"test_retrieve",(allocator *)&local_fc);
  test_ang3._vptr_CEAngle = (_func_int **)CONCAT44(test_ang3._vptr_CEAngle._4_4_,0xdc);
  (**(code **)(*(long *)this + 0x58))(this,&local_d8,&test_ang2,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_fc);
  CEAngle::CEAngle(&test_ang2,&test_ang);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CEAngle::operator_cast_to_double(&test_ang2);
  test_ang3._vptr_CEAngle = (_func_int **)(test_deg * 0.017453292519943295);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"test_retrieve",&local_fe);
  local_fc = 0xdf;
  (**(code **)(*(long *)this + 0x58))(this,&local_d8,&test_ang3,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_fe);
  CEAngle::CEAngle(&test_ang3);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x4039000000000000;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x4000000000000000;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x400a666666666666;
  std::allocator<double>::allocator((allocator<double> *)&local_fe);
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&local_d8;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_f8,__l_03,(allocator<double> *)&local_fe);
  local_fc = HMS;
  CEAngle::SetAngle(&test_ang3,&local_f8,&local_fc);
  std::vector<double,_std::allocator<double>_>::~vector(&local_f8);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_fe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"HMS bad hours exception",&local_fe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"test_retrieve",&local_fd);
  local_fc = 0xe8;
  (**(code **)(*(long *)this + 0x50))(this,0,&local_f8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_fd);
  std::__cxx11::string::~string((string *)&local_f8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_fe);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3ff0000000000000;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc000000000000000;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x400a666666666666;
  std::allocator<double>::allocator((allocator<double> *)&local_fe);
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&local_d8;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_f8,__l_04,(allocator<double> *)&local_fe);
  local_fc = HMS;
  CEAngle::SetAngle(&test_ang3,&local_f8,&local_fc);
  std::vector<double,_std::allocator<double>_>::~vector(&local_f8);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_fe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"HMS bad minutes exception",&local_fe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"test_retrieve",&local_fd);
  local_fc = 0xef;
  (**(code **)(*(long *)this + 0x50))(this,0,&local_f8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_fd);
  std::__cxx11::string::~string((string *)&local_f8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_fe);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3ff0000000000000;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x4000000000000000;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0xc00a666666666666;
  std::allocator<double>::allocator((allocator<double> *)&local_fe);
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)&local_d8;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_f8,__l_05,(allocator<double> *)&local_fe);
  local_fc = HMS;
  CEAngle::SetAngle(&test_ang3,&local_f8,&local_fc);
  std::vector<double,_std::allocator<double>_>::~vector(&local_f8);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_fe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"HMS bad seconds exception",&local_fe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"test_retrieve",&local_fd);
  local_fc = 0xf6;
  (**(code **)(*(long *)this + 0x50))(this,0,&local_f8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_fd);
  std::__cxx11::string::~string((string *)&local_f8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_fe);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x4077200000000000;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x4000000000000000;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x400a666666666666;
  std::allocator<double>::allocator((allocator<double> *)&local_fe);
  __l_06._M_len = 3;
  __l_06._M_array = (iterator)&local_d8;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_f8,__l_06,(allocator<double> *)&local_fe);
  local_fc = DMS;
  CEAngle::SetAngle(&test_ang3,&local_f8,&local_fc);
  std::vector<double,_std::allocator<double>_>::~vector(&local_f8);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_fe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"DMS bad degrees exception",&local_fe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"test_retrieve",&local_fd);
  local_fc = 0xfe;
  (**(code **)(*(long *)this + 0x50))(this,0,&local_f8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_fd);
  std::__cxx11::string::~string((string *)&local_f8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_fe);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3ff0000000000000;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc000000000000000;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x400a666666666666;
  std::allocator<double>::allocator((allocator<double> *)&local_fe);
  __l_07._M_len = 3;
  __l_07._M_array = (iterator)&local_d8;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_f8,__l_07,(allocator<double> *)&local_fe);
  local_fc = DMS;
  CEAngle::SetAngle(&test_ang3,&local_f8,&local_fc);
  std::vector<double,_std::allocator<double>_>::~vector(&local_f8);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_fe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"DMS bad arcmins exception",&local_fe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"test_retrieve",&local_fd);
  local_fc = 0x105;
  (**(code **)(*(long *)this + 0x50))(this,0,&local_f8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_fd);
  std::__cxx11::string::~string((string *)&local_f8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_fe);
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3ff0000000000000;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x4000000000000000;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0xc00a666666666666;
  std::allocator<double>::allocator((allocator<double> *)&local_fe);
  __l_08._M_len = 3;
  __l_08._M_array = (iterator)&local_d8;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_f8,__l_08,(allocator<double> *)&local_fe);
  local_fc = DMS;
  CEAngle::SetAngle(&test_ang3,&local_f8,&local_fc);
  std::vector<double,_std::allocator<double>_>::~vector(&local_f8);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_fe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"DMS bad arcsecs exception",&local_fe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"test_retrieve",&local_fd);
  local_fc = 0x10c;
  (**(code **)(*(long *)this + 0x50))(this,0,&local_f8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_fd);
  std::__cxx11::string::~string((string *)&local_f8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_fe);
  uVar1 = (**(code **)(*(long *)this + 0x18))(this);
  CEAngle::~CEAngle(&test_ang3);
  CEAngle::~CEAngle(&test_ang2);
  std::__cxx11::string::~string((string *)&dms_str);
  std::__cxx11::string::~string((string *)&hms_str);
  CEAngle::~CEAngle(&test_ang);
  return (bool)uVar1;
}

Assistant:

bool test_CEAngle::test_retrieve(void)
{
    double angle = M_PI;

    // Test getting from...
    // ... degrees
    test_double(CEAngle::Deg(180), angle, __func__, __LINE__);
    // ... radians
    test_double(CEAngle::Rad(angle), angle, __func__, __LINE__);
    // ... Hms (version 1)
    test_double(CEAngle::Hms("12:00:00"), angle, __func__, __LINE__);
    test_double(CEAngle::Hms("12 00 00"), angle, __func__, __LINE__);
    test_double(CEAngle::Hms("12.00.00", '.'), angle, __func__, __LINE__);
    // ... HMS (version 2)
    test_double(CEAngle::Hms({12.0, 0.0, 0.0, 0.0}), angle, __func__, __LINE__);
    // ... Dms (version 1)
    test_double(CEAngle::Dms("180:00:00"), angle, __func__, __LINE__);
    test_double(CEAngle::Dms("180 00 00"), angle, __func__, __LINE__);
    test_double(CEAngle::Dms("180'00'00", '\''), angle, __func__, __LINE__);
    // ... DMS (version 2)
    test_double(CEAngle::Dms({180, 0, 0, 0.0}), angle, __func__, __LINE__);

    // Now test some of the other ways in which to get back the angle using
    // a particular format. For this, we will use 315.25 degrees
    double test_deg = 315.25;
    CEAngle test_ang(test_deg * DD2R);

    // Deg
    test_double(test_ang.Deg(), test_deg, __func__, __LINE__);

    // Rad
    test_double(test_ang.Rad(), test_deg*DD2R, __func__, __LINE__);
    
    // HMS as string
    std::string hms_str = test_ang.HmsStr('\'');
    hms_str = std::string(hms_str.begin(), hms_str.begin()+11);
    test_string(hms_str, "21'01'00.00", __func__, __LINE__);
    
    // HMS as vector<double>
    test_vect(test_ang.HmsVect(), {21, 1, 0, 0}, __func__, __LINE__);
    
    // DMS as string
    std::string dms_str = test_ang.DmsStr('"');
    dms_str = std::string(dms_str.begin(), dms_str.begin()+12);
    test_string(dms_str, "315\"15\"00.00", __func__, __LINE__);

    // DMS as vector<double>
    test_vect(test_ang.DmsVect(), {315, 15, 0, 0}, __func__, __LINE__);

    // Can the angle be retrieved directly as a double?
    test_double(test_ang, test_deg*DD2R, __func__, __LINE__);
    const CEAngle test_ang2(test_ang);
    // Test 'const' version
    test_double(test_ang2, test_deg*DD2R, __func__, __LINE__);


    // Test exceptions
    CEAngle test_ang3;

    // Incorrect hour
    try {
        test_ang3.SetAngle({25, 2, 3.3}, CEAngleType::HMS);
        test(false, "HMS bad hours exception", __func__, __LINE__);
    } catch (CEException::invalid_value& e) {
        test(true, "HMS bad hours exception", __func__, __LINE__);
    }
    // Incorrect minutes
    try {
        test_ang3.SetAngle({1, -2, 3.3}, CEAngleType::HMS);
        test(false, "HMS bad minutes exception", __func__, __LINE__);
    } catch (CEException::invalid_value& e) {
        test(true, "HMS bad minutes exception", __func__, __LINE__);
    }
    // Incorrect seconds
    try {
        test_ang3.SetAngle({1, 2, -3.3}, CEAngleType::HMS);
        test(false, "HMS bad seconds exception", __func__, __LINE__);
    } catch (CEException::invalid_value& e) {
        test(true, "HMS bad seconds exception", __func__, __LINE__);
    }

    // Incorrect degrees
    try {
        test_ang3.SetAngle({370, 2, 3.3}, CEAngleType::DMS);
        test(false, "DMS bad degrees exception", __func__, __LINE__);
    } catch (CEException::invalid_value& e) {
        test(true, "DMS bad degrees exception", __func__, __LINE__);
    }
    // Incorrect minutes
    try {
        test_ang3.SetAngle({1, -2, 3.3}, CEAngleType::DMS);
        test(false, "DMS bad arcmins exception", __func__, __LINE__);
    } catch (CEException::invalid_value& e) {
        test(true, "DMS bad arcmins exception", __func__, __LINE__);
    }
    // Incorrect seconds
    try {
        test_ang3.SetAngle({1, 2, -3.3}, CEAngleType::DMS);
        test(false, "DMS bad arcsecs exception", __func__, __LINE__);
    } catch (CEException::invalid_value& e) {
        test(true, "DMS bad arcsecs exception", __func__, __LINE__);
    }

    return pass();
}